

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O1

bool __thiscall Gluco::Solver::locked(Solver *this,Clause *c)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  lbool *plVar4;
  long lVar5;
  byte bVar6;
  
  bVar6 = (byte)*(int *)&c[1].header & 1;
  plVar4 = (this->assigns).data;
  lVar5 = (long)(*(int *)&c[1].header >> 1);
  bVar1 = plVar4[lVar5].value;
  if (*(int *)&(c->header).field_0x4 < 3) {
    if (bVar1 == bVar6) {
      uVar3 = (this->vardata).data[lVar5].reason;
      if ((ulong)uVar3 != 0xffffffff) {
        if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar3) goto LAB_005c148c;
        if ((Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar3) == c) {
          return true;
        }
      }
    }
    iVar2 = *(int *)&c[1].header.field_0x4;
    lVar5 = (long)(iVar2 >> 1);
    if (plVar4[lVar5].value != ((byte)iVar2 & 1)) {
      return false;
    }
  }
  else if (bVar1 != bVar6) {
    return false;
  }
  uVar3 = (this->vardata).data[lVar5].reason;
  if ((ulong)uVar3 == 0xffffffff) {
    return false;
  }
  if (uVar3 < (this->ca).super_RegionAllocator<unsigned_int>.sz) {
    return (Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar3) == c;
  }
LAB_005c148c:
  __assert_fail("r >= 0 && r < sz",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Alloc.h"
                ,0x46,
                "const T *Gluco::RegionAllocator<unsigned int>::lea(Ref) const [T = unsigned int]");
}

Assistant:

inline bool     Solver::locked          (const Clause& c) const { 
   if(c.size()>2) 
     return value(c[0]) == l_True && reason(var(c[0])) != CRef_Undef && ca.lea(reason(var(c[0]))) == &c; 
   return 
     (value(c[0]) == l_True && reason(var(c[0])) != CRef_Undef && ca.lea(reason(var(c[0]))) == &c)
     || 
     (value(c[1]) == l_True && reason(var(c[1])) != CRef_Undef && ca.lea(reason(var(c[1]))) == &c);
 }